

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::anon_unknown_0::save_file_impl
               (xml_document *doc,FILE *file,char_t *indent,uint flags,xml_encoding encoding)

{
  int iVar1;
  bool bVar2;
  xml_writer_file writer;
  xml_writer_file local_40;
  
  if (file != (FILE *)0x0) {
    xml_writer_file::xml_writer_file(&local_40,file);
    xml_document::save(doc,&local_40.super_xml_writer,indent,flags,encoding);
    iVar1 = fflush((FILE *)file);
    if (iVar1 == 0) {
      iVar1 = ferror((FILE *)file);
      bVar2 = iVar1 == 0;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

PUGI_IMPL_FN bool save_file_impl(const xml_document& doc, FILE* file, const char_t* indent, unsigned int flags, xml_encoding encoding)
	{
		if (!file) return false;

		xml_writer_file writer(file);
		doc.save(writer, indent, flags, encoding);

		return fflush(file) == 0 && ferror(file) == 0;
	}